

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O3

void duckdb::ReadBlobFunction::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_251;
  LogicalType local_250;
  vector<duckdb::LogicalType,_true> local_238;
  string local_220;
  TableFunctionSet local_200;
  TableFunction local_1c8;
  
  local_220.field_2._M_allocated_capacity = 0x6f6c625f64616572;
  local_220.field_2._8_2_ = 0x62;
  local_220._M_string_length = 9;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  LogicalType::LogicalType(&local_250,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_250;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_238,__l,
             &local_251);
  TableFunction::TableFunction
            (&local_1c8,&local_220,&local_238,ReadFileExecute<duckdb::ReadBlobOperation>,
             ReadFileBind<duckdb::ReadBlobOperation>,ReadFileInitGlobal,
             (table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_238);
  LogicalType::~LogicalType(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  local_1c8.table_scan_progress = ReadFileProgress;
  local_1c8.cardinality = ReadFileCardinality;
  local_1c8.projection_pushdown = true;
  MultiFileReader::CreateFunctionSet(&local_200,&local_1c8);
  BuiltinFunctions::AddFunction(set,&local_200);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_200.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_200.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_200.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_1c8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02432fe0;
  if (local_1c8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1c8.super_SimpleNamedParameterFunction);
  return;
}

Assistant:

void ReadBlobFunction::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(MultiFileReader::CreateFunctionSet(GetFunction<ReadBlobOperation>()));
}